

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clEnqueueFillBuffer(cl_command_queue command_queue,cl_mem buffer,void *pattern,
                          size_t pattern_size,size_t offset,size_t size,
                          cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  bool bVar1;
  bool bVar2;
  cl_int cVar3;
  CLIntercept *this;
  cl_icd_dispatch *pcVar4;
  uint64_t enqueueCounter_00;
  SConfig *pSVar5;
  CLIntercept *pCVar6;
  SConfig *pSVar7;
  undefined8 uVar8;
  cl_command_queue in_RCX;
  void *in_RDX;
  cl_mem in_RSI;
  cl_command_queue in_RDI;
  size_t *in_R8;
  _cl_event *in_R9;
  cl_uint in_stack_00000008;
  cl_command_queue in_stack_00000010;
  cl_event *in_stack_00000018;
  CLIntercept *in_stack_00000128;
  time_point toolEnd_1;
  time_point toolStart_1;
  cl_int e;
  time_point toolEnd;
  time_point toolStart;
  time_point cpuEnd;
  time_point cpuStart;
  bool isLocalEvent;
  cl_event local_event;
  time_point queuedTime;
  string deviceTag;
  string hostTag;
  string eventWaitListString;
  uint64_t enqueueCounter;
  cl_int retVal;
  CLIntercept *pIntercept;
  cl_command_queue in_stack_fffffffffffffba0;
  _cl_event *in_stack_fffffffffffffbb0;
  CObjectTracker *in_stack_fffffffffffffbb8;
  uint64_t in_stack_fffffffffffffbc0;
  CLIntercept *in_stack_fffffffffffffbc8;
  allocator *paVar9;
  CLIntercept *in_stack_fffffffffffffbd0;
  allocator *in_stack_fffffffffffffbf8;
  CLIntercept *in_stack_fffffffffffffc00;
  CLIntercept *in_stack_fffffffffffffc08;
  cl_event *in_stack_fffffffffffffc10;
  cl_event *in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  cl_uint numEvents;
  cl_event p_Var10;
  char *in_stack_fffffffffffffc28;
  CLIntercept *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  undefined1 includeId;
  CObjectTracker *in_stack_fffffffffffffc40;
  SConfig *in_stack_fffffffffffffc48;
  CLIntercept *in_stack_fffffffffffffc50;
  time_point in_stack_fffffffffffffc58;
  time_point in_stack_fffffffffffffc60;
  time_point in_stack_fffffffffffffc68;
  time_point in_stack_fffffffffffffc70;
  SConfig *in_stack_fffffffffffffca0;
  SConfig *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  SConfig *in_stack_fffffffffffffcb8;
  SConfig *in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  time_point in_stack_fffffffffffffce0;
  SConfig *in_stack_fffffffffffffcf0;
  int local_264;
  undefined8 local_260;
  undefined8 local_258;
  cl_int in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  cl_int in_stack_fffffffffffffdbc;
  CLIntercept *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  CLIntercept *in_stack_fffffffffffffdd0;
  allocator local_211;
  string local_210 [32];
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  allocator local_1b9;
  string local_1b8 [32];
  undefined8 local_198;
  undefined8 local_140;
  cl_event local_e0;
  undefined8 local_d8;
  string local_d0 [32];
  string local_b0 [48];
  string local_80 [8];
  size_t *in_stack_ffffffffffffff88;
  cl_uint in_stack_ffffffffffffff94;
  cl_kernel in_stack_ffffffffffffff98;
  uint64_t uVar11;
  undefined4 in_stack_ffffffffffffffa8;
  size_t *psVar12;
  cl_command_queue p_Var13;
  cl_int local_14;
  
  includeId = (undefined1)((ulong)in_stack_fffffffffffffc38 >> 0x38);
  numEvents = (cl_uint)((ulong)in_stack_fffffffffffffc20 >> 0x20);
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (pcVar4 = CLIntercept::dispatch(this),
     pcVar4->clEnqueueFillBuffer == (cl_api_clEnqueueFillBuffer)0x0)) {
    local_264 = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_264);
    local_14 = -0x24;
  }
  else {
    local_14 = 0;
    enqueueCounter_00 = CLIntercept::incrementEnqueueCounter(in_stack_fffffffffffffc08);
    pSVar5 = CLIntercept::config(this);
    if (((pSVar5->AubCapture & 1U) != 0) &&
       ((bVar1 = CLIntercept::checkAubCaptureEnqueueLimits(this,enqueueCounter_00), bVar1 &&
        (pSVar5 = CLIntercept::config(this), (pSVar5->AubCaptureIndividualEnqueues & 1U) == 0)))) {
      in_stack_fffffffffffffba0 = in_RDI;
      CLIntercept::startAubCapture
                (this,(char *)CONCAT44(local_14,in_stack_ffffffffffffffa8),enqueueCounter_00,
                 in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,in_R8
                 ,in_RCX);
    }
    pSVar5 = CLIntercept::config(this);
    if ((pSVar5->NullEnqueue & 1U) == 0) {
      getFormattedEventWaitList_abi_cxx11_
                (in_stack_fffffffffffffbc8,(cl_uint)(in_stack_fffffffffffffbc0 >> 0x20),
                 (cl_event *)in_stack_fffffffffffffbb8);
      pSVar5 = CLIntercept::config(this);
      psVar12 = in_R8;
      p_Var13 = in_RCX;
      if ((pSVar5->CallLogging & 1U) != 0) {
        uVar11 = enqueueCounter_00;
        pCVar6 = this;
        in_stack_fffffffffffffbb8 = (CObjectTracker *)std::__cxx11::string::c_str();
        in_stack_fffffffffffffbb0 = in_R9;
        CLIntercept::callLoggingEnter
                  (this,"clEnqueueFillBuffer",enqueueCounter_00,(cl_kernel)0x0,
                   "queue = %p, buffer = %p, pattern_size = %zu, offset = %zu, size = %zu%s",in_RDI,
                   in_RSI,in_RCX,in_R8);
        in_stack_fffffffffffffba0 = in_RCX;
        enqueueCounter_00 = uVar11;
        this = pCVar6;
      }
      pSVar5 = CLIntercept::config(this);
      if ((pSVar5->EventChecking & 1U) != 0) {
        CLIntercept::checkEventList
                  (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,numEvents,
                   in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      }
      std::__cxx11::string::string(local_b0);
      std::__cxx11::string::string(local_d0);
      pSVar5 = CLIntercept::config(this);
      if ((((pSVar5->ChromeCallLogging & 1U) != 0) ||
          ((pSVar5 = CLIntercept::config(this), (pSVar5->HostPerformanceTiming & 1U) != 0 &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,enqueueCounter_00),
           bVar1)))) ||
         (((pSVar5 = CLIntercept::config(this), (pSVar5->DevicePerformanceTiming & 1U) != 0 ||
           (((pSVar5 = CLIntercept::config(this), (pSVar5->ITTPerformanceTiming & 1U) != 0 ||
             (pSVar5 = CLIntercept::config(this), (pSVar5->ChromePerformanceTiming & 1U) != 0)) ||
            (pSVar5 = CLIntercept::config(this),
            (pSVar5->DevicePerfCounterEventBasedSampling & 1U) != 0)))) &&
          (bVar1 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits(this,enqueueCounter_00),
          bVar1)))) {
        CLIntercept::getTimingTagBlocking
                  ((CLIntercept *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   in_stack_fffffffffffffcc8,(cl_bool)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
                   (size_t)in_stack_fffffffffffffcb8,
                   (string *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                   (string *)in_stack_fffffffffffffca8);
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffba0);
      local_e0 = (cl_event)0x0;
      bVar1 = false;
      pSVar5 = CLIntercept::config(this);
      if ((((pSVar5->DevicePerformanceTiming & 1U) != 0) ||
          (pSVar5 = CLIntercept::config(this), (pSVar5->ITTPerformanceTiming & 1U) != 0)) ||
         ((pSVar5 = CLIntercept::config(this), (pSVar5->ChromePerformanceTiming & 1U) != 0 ||
          (in_stack_fffffffffffffcf0 = CLIntercept::config(this),
          (in_stack_fffffffffffffcf0->DevicePerfCounterEventBasedSampling & 1U) != 0)))) {
        local_d8 = std::chrono::_V2::steady_clock::now();
        bVar1 = in_stack_00000018 == (cl_event *)0x0;
        if (bVar1) {
          in_stack_00000018 = &local_e0;
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffba0);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffba0);
      pSVar5 = CLIntercept::config(this);
      if (((pSVar5->HostPerformanceTiming & 1U) != 0) ||
         (in_stack_fffffffffffffce0.__d.__r = (duration)CLIntercept::config(this),
         (((SConfig *)in_stack_fffffffffffffce0.__d.__r)->ChromeCallLogging & 1U) != 0)) {
        std::chrono::_V2::steady_clock::now();
      }
      pCVar6 = (CLIntercept *)CLIntercept::dispatch(this);
      cVar3 = (*(pCVar6->m_Dispatch).clReleaseDevice)
                        (in_RDI,in_RSI,in_RDX,(size_t)p_Var13,(size_t)psVar12,(size_t)in_R9,
                         in_stack_00000008,(cl_event *)in_stack_00000010,in_stack_00000018);
      local_14 = cVar3;
      pSVar5 = CLIntercept::config(this);
      in_stack_fffffffffffffba0 = in_stack_00000010;
      if (((pSVar5->HostPerformanceTiming & 1U) != 0) ||
         (in_stack_fffffffffffffcc0 = CLIntercept::config(this),
         in_stack_fffffffffffffba0 = in_stack_00000010,
         (in_stack_fffffffffffffcc0->ChromeCallLogging & 1U) != 0)) {
        std::chrono::_V2::steady_clock::now();
        in_stack_fffffffffffffcb8 = CLIntercept::config(this);
        if (((in_stack_fffffffffffffcb8->HostPerformanceTiming & 1U) != 0) &&
           (in_stack_fffffffffffffcb7 =
                 CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,enqueueCounter_00),
           (bool)in_stack_fffffffffffffcb7)) {
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffc60.__d.__r,
                     (char *)in_stack_fffffffffffffc58.__d.__r,(string *)in_stack_fffffffffffffc50,
                     in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        }
      }
      in_stack_fffffffffffffca8 = CLIntercept::config(this);
      if ((((((in_stack_fffffffffffffca8->DevicePerformanceTiming & 1U) != 0) ||
            (in_stack_fffffffffffffca0 = CLIntercept::config(this),
            (in_stack_fffffffffffffca0->ITTPerformanceTiming & 1U) != 0)) ||
           (pSVar7 = CLIntercept::config(this), (pSVar7->ChromePerformanceTiming & 1U) != 0)) ||
          (pSVar7 = CLIntercept::config(this),
          (pSVar7->DevicePerfCounterEventBasedSampling & 1U) != 0)) &&
         (in_stack_00000018 != (cl_event *)0x0)) {
        bVar2 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits(this,enqueueCounter_00);
        if (bVar2) {
          CLIntercept::addTimingEvent
                    (pCVar6,(char *)CONCAT44(cVar3,in_stack_fffffffffffffcd0),(uint64_t)pSVar5,
                     in_stack_fffffffffffffce0,(string *)in_stack_fffffffffffffcc0,
                     (cl_command_queue)in_stack_fffffffffffffcb8,(cl_event)in_stack_fffffffffffffcf0
                    );
        }
        if (bVar1) {
          pcVar4 = CLIntercept::dispatch(this);
          (*pcVar4->clReleaseEvent)(*in_stack_00000018);
          in_stack_00000018 = (cl_event *)0x0;
        }
      }
      pSVar5 = CLIntercept::config(this);
      if (((((pSVar5->ErrorLogging & 1U) != 0) ||
           (in_stack_fffffffffffffc70.__d.__r = (duration)CLIntercept::config(this),
           (((SConfig *)in_stack_fffffffffffffc70.__d.__r)->ErrorAssert & 1U) != 0)) ||
          (in_stack_fffffffffffffc68.__d.__r = (duration)CLIntercept::config(this),
          (((SConfig *)in_stack_fffffffffffffc68.__d.__r)->NoErrors & 1U) != 0)) && (local_14 != 0))
      {
        in_stack_fffffffffffffc60.__d.__r = (duration)CLIntercept::config(this);
        if (((((CLIntercept *)in_stack_fffffffffffffc60.__d.__r)->m_Mutex).super___mutex_base.
             _M_mutex.__size[0x13] & 1U) != 0) {
          CLIntercept::logError
                    (in_stack_fffffffffffffdc0,
                     (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     in_stack_fffffffffffffdb4);
        }
        in_stack_fffffffffffffc58.__d.__r = (duration)CLIntercept::config(this);
        if ((((SConfig *)in_stack_fffffffffffffc58.__d.__r)->ErrorAssert & 1U) != 0) {
          raise(5);
        }
        in_stack_fffffffffffffc50 = (CLIntercept *)CLIntercept::config(this);
        if (((ulong)(in_stack_fffffffffffffc50->m_Dispatch).clCreateSubDevices & 0x100000000) != 0)
        {
          local_14 = 0;
        }
      }
      in_stack_fffffffffffffc48 = CLIntercept::config(this);
      if ((in_stack_fffffffffffffc48->LeakChecking & 1U) != 0) {
        in_stack_fffffffffffffc40 = CLIntercept::objectTracker(this);
        if (in_stack_00000018 == (cl_event *)0x0) {
          includeId = 0;
        }
        else {
          includeId = (undefined1)((ulong)*in_stack_00000018 >> 0x38);
        }
        CObjectTracker::AddAllocation<_cl_event*>
                  (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
      }
      in_stack_fffffffffffffc30 = (CLIntercept *)CLIntercept::config(this);
      if (((in_stack_fffffffffffffc30->m_Mutex).super___mutex_base._M_mutex.__size[3] & 1U) != 0) {
        CLIntercept::callLoggingExit
                  (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,numEvents,
                   in_stack_fffffffffffffc18,(cl_sync_point_khr *)in_stack_fffffffffffffc10);
      }
      pSVar5 = CLIntercept::config(this);
      if ((pSVar5->ChromeCallLogging & 1U) != 0) {
        CLIntercept::chromeCallLoggingExit
                  (in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->SuppressLogging,
                   (string *)in_stack_fffffffffffffc40,(bool)includeId,
                   (uint64_t)in_stack_fffffffffffffc30,in_stack_fffffffffffffc60,
                   in_stack_fffffffffffffc58);
      }
      if (in_stack_00000018 == (cl_event *)0x0) {
        p_Var10 = (cl_event)0x0;
      }
      else {
        p_Var10 = *in_stack_00000018;
      }
      if ((p_Var10 != (cl_event)0x0) &&
         ((pSVar5 = CLIntercept::config(this), (pSVar5->ChromeCallLogging & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(this), (pSVar5->ChromePerformanceTiming & 1U) != 0)))) {
        if (in_stack_00000018 == (cl_event *)0x0) {
          in_stack_fffffffffffffc00 = (CLIntercept *)0x0;
        }
        else {
          in_stack_fffffffffffffc00 = (CLIntercept *)*in_stack_00000018;
        }
        CLIntercept::addEvent
                  (in_stack_fffffffffffffbd0,(cl_event)in_stack_fffffffffffffbc8,
                   in_stack_fffffffffffffbc0);
      }
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_80);
    }
    pSVar5 = CLIntercept::config(this);
    if ((pSVar5->FinishAfterEnqueue & 1U) == 0) {
      pSVar5 = CLIntercept::config(this);
      if ((pSVar5->FlushAfterEnqueue & 1U) != 0) {
        pcVar4 = CLIntercept::dispatch(this);
        (*pcVar4->clFlush)(in_RDI);
      }
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffba0);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffba0);
      pSVar5 = CLIntercept::config(this);
      if (((pSVar5->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar5 = CLIntercept::config(this), (pSVar5->HostPerformanceTiming & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(this), (pSVar5->ChromeCallLogging & 1U) != 0)))) {
        local_140 = std::chrono::_V2::steady_clock::now();
      }
      CLIntercept::logFlushOrFinishAfterEnqueueStart
                ((CLIntercept *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                 &in_stack_fffffffffffffca8->SuppressLogging,
                 &in_stack_fffffffffffffca0->SuppressLogging);
      pcVar4 = CLIntercept::dispatch(this);
      (*pcVar4->clFinish)(in_RDI);
      CLIntercept::logFlushOrFinishAfterEnqueueEnd
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                 (char *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      pSVar5 = CLIntercept::config(this);
      if (((pSVar5->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar5 = CLIntercept::config(this), (pSVar5->HostPerformanceTiming & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(this), (pSVar5->ChromeCallLogging & 1U) != 0)))) {
        uVar8 = std::chrono::_V2::steady_clock::now();
        pSVar5 = CLIntercept::config(this);
        if (((pSVar5->HostPerformanceTiming & 1U) != 0) &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,enqueueCounter_00),
           bVar1)) {
          in_stack_fffffffffffffbf8 = (allocator *)&stack0xfffffffffffffe7f;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&stack0xfffffffffffffe80,"",in_stack_fffffffffffffbf8);
          local_198 = uVar8;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffc60.__d.__r,
                     (char *)in_stack_fffffffffffffc58.__d.__r,(string *)in_stack_fffffffffffffc50,
                     in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe7f);
        }
        pSVar5 = CLIntercept::config(this);
        if ((pSVar5->ChromeCallLogging & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1b8,"",&local_1b9);
          local_1c8 = local_140;
          local_1d0 = uVar8;
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->SuppressLogging,
                     (string *)in_stack_fffffffffffffc40,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffc30,in_stack_fffffffffffffc60,
                     in_stack_fffffffffffffc58);
          std::__cxx11::string::~string(local_1b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffba0);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffba0);
      pSVar5 = CLIntercept::config(this);
      if (((pSVar5->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar5 = CLIntercept::config(this), (pSVar5->HostPerformanceTiming & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(this), (pSVar5->ChromeCallLogging & 1U) != 0)))) {
        local_1e8 = std::chrono::_V2::steady_clock::now();
        local_1d8 = local_1e8;
      }
      CLIntercept::checkTimingEvents(in_stack_00000128);
      pSVar5 = CLIntercept::config(this);
      if (((pSVar5->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar5 = CLIntercept::config(this), (pSVar5->HostPerformanceTiming & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(this), (pSVar5->ChromeCallLogging & 1U) != 0)))) {
        local_1f0 = std::chrono::_V2::steady_clock::now();
        local_1e0 = local_1f0;
        pSVar5 = CLIntercept::config(this);
        if (((pSVar5->HostPerformanceTiming & 1U) != 0) &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,enqueueCounter_00),
           bVar1)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_210,"",&local_211);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffc60.__d.__r,
                     (char *)in_stack_fffffffffffffc58.__d.__r,(string *)in_stack_fffffffffffffc50,
                     in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          std::__cxx11::string::~string(local_210);
          std::allocator<char>::~allocator((allocator<char> *)&local_211);
        }
        pSVar5 = CLIntercept::config(this);
        if ((pSVar5->ChromeCallLogging & 1U) != 0) {
          paVar9 = (allocator *)&stack0xfffffffffffffdb7;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&stack0xfffffffffffffdb8,"",paVar9);
          local_258 = local_1d8;
          local_260 = local_1e0;
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->SuppressLogging,
                     (string *)in_stack_fffffffffffffc40,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffc30,in_stack_fffffffffffffc60,
                     in_stack_fffffffffffffc58);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdb7);
        }
      }
    }
    pSVar5 = CLIntercept::config(this);
    if (((pSVar5->AubCapture & 1U) != 0) &&
       ((pSVar5 = CLIntercept::config(this), (pSVar5->AubCaptureIndividualEnqueues & 1U) != 0 ||
        (bVar1 = CLIntercept::checkAubCaptureEnqueueLimits(this,enqueueCounter_00), !bVar1)))) {
      CLIntercept::stopAubCapture
                (in_stack_fffffffffffffc00,(cl_command_queue)in_stack_fffffffffffffbf8);
    }
  }
  return local_14;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clEnqueueFillBuffer)(
    cl_command_queue command_queue,
    cl_mem buffer,
    const void* pattern,
    size_t pattern_size,
    size_t offset,
    size_t size,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clEnqueueFillBuffer )
    {
        cl_int  retVal = CL_SUCCESS;

        INCREMENT_ENQUEUE_COUNTER();
        CHECK_AUBCAPTURE_START( command_queue );

        if( pIntercept->config().NullEnqueue == false )
        {
            const std::string eventWaitListString = getFormattedEventWaitList(
                pIntercept,
                num_events_in_wait_list,
                event_wait_list);

            CALL_LOGGING_ENTER( "queue = %p, buffer = %p, pattern_size = %zu, offset = %zu, size = %zu%s",
                command_queue,
                buffer,
                pattern_size,
                offset,
                size,
                eventWaitListString.c_str() );
            CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
            GET_TIMING_TAGS_BLOCKING( CL_FALSE, size );
            DEVICE_PERFORMANCE_TIMING_START( event );
            HOST_PERFORMANCE_TIMING_START();

            retVal = pIntercept->dispatch().clEnqueueFillBuffer(
                command_queue,
                buffer,
                pattern,
                pattern_size,
                offset,
                size,
                num_events_in_wait_list,
                event_wait_list,
                event );

            HOST_PERFORMANCE_TIMING_END_WITH_TAG();
            DEVICE_PERFORMANCE_TIMING_END_WITH_TAG( command_queue, event );
            CHECK_ERROR( retVal );
            ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
            CALL_LOGGING_EXIT_EVENT_WITH_TAG( retVal, event );
            ADD_EVENT( event ? event[0] : NULL );
        }

        FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
        CHECK_AUBCAPTURE_STOP( command_queue );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}